

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

bool __thiscall inja::Renderer::truthy(Renderer *this,json *var)

{
  bool bVar1;
  
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::empty(var);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    if ((byte)(var->m_type - number_integer) < 3) {
      bVar1 = nlohmann::operator!=<int,_0>(var,0);
      return bVar1;
    }
    if (var->m_type == string) {
      bVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::empty(var);
      bVar1 = !bVar1;
    }
    else {
      bVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::get<bool,_bool,_0>(var);
    }
  }
  return bVar1;
}

Assistant:

bool truthy(const json& var) const {
		if (var.empty()) {
			return false;
		} else if (var.is_number()) {
			return (var != 0);
		} else if (var.is_string()) {
			return !var.empty();
		}

		try {
			return var.get<bool>();
		} catch (json::type_error& e) {
			inja_throw("json_error", e.what());
			throw;
		}
	}